

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingIndex.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_79f::RingIndexTest_RingIndex2_Test::~RingIndexTest_RingIndex2_Test
          (RingIndexTest_RingIndex2_Test *this)

{
  RingIndexTest_RingIndex2_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST( RingIndexTest, RingIndex2)
	{
		RingIndex ri2;
		EXPECT_EQ( ri2++, 0 );
		EXPECT_EQ( ++ri2, 2 );
		EXPECT_EQ( ri2-2, 0 );
		EXPECT_EQ( ri2-=2, 0 );
		EXPECT_EQ( --ri2, ri2.get_max()-1 );
		EXPECT_EQ( ri2+1, 0 );
		EXPECT_EQ( ri2-5, ri2.get_max()-6 );
	}